

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiTable * __thiscall ImPool<ImGuiTable>::TryGetMapData(ImPool<ImGuiTable> *this,ImPoolIdx n)

{
  ImGuiStoragePair *pIVar1;
  int idx;
  ImPoolIdx n_local;
  ImPool<ImGuiTable> *this_local;
  
  pIVar1 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[](&(this->Map).Data,n);
  if ((pIVar1->field_1).val_i == -1) {
    this_local = (ImPool<ImGuiTable> *)0x0;
  }
  else {
    this_local = (ImPool<ImGuiTable> *)GetByIndex(this,(pIVar1->field_1).val_i);
  }
  return (ImGuiTable *)this_local;
}

Assistant:

T*          TryGetMapData(ImPoolIdx n)          { int idx = Map.Data[n].val_i; if (idx == -1) return NULL; return GetByIndex(idx); }